

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-view.c
# Opt level: O0

_Bool glow_can_light_wall(chunk_conflict *c,player *p,loc wgrid)

{
  loc_conflict grid;
  loc_conflict grid_00;
  loc sgrid;
  loc_conflict grid_01;
  loc_conflict grid_02;
  loc sgrid_00;
  loc_conflict grid_03;
  loc_conflict grid_04;
  loc_conflict grid_05;
  loc sgrid_01;
  loc_conflict grid_06;
  loc_conflict grid_07;
  loc_conflict grid_08;
  loc sgrid_02;
  loc_conflict grid_09;
  loc_conflict grid_10;
  loc sgrid_03;
  loc_conflict grid_11;
  loc_conflict grid_12;
  loc_conflict grid_13;
  loc sgrid_04;
  _Bool _Var1;
  wchar_t wVar2;
  loc_conflict lVar3;
  loc chk;
  loc pn;
  player *p_local;
  chunk_conflict *c_local;
  wchar_t wStack_10;
  loc wgrid_local;
  
  wVar2 = motion_dir(wgrid,p->grid);
  lVar3 = (loc_conflict)next_grid(wgrid,wVar2);
  _Var1 = loc_eq((loc)lVar3,wgrid);
  if (_Var1) {
    wgrid_local.x._3_1_ = true;
  }
  else {
    _Var1 = square_allowslos((chunk *)c,lVar3);
    if ((_Var1) && (_Var1 = square_isglow((chunk *)c,lVar3), _Var1)) {
      wgrid_local.x._3_1_ = true;
    }
    else {
      chk.x = lVar3.x;
      c_local._4_4_ = wgrid.x;
      chk.y = lVar3.y;
      if (chk.x == c_local._4_4_) {
        wVar2 = c_local._4_4_ + L'\xffffffff';
        lVar3.y = chk.y;
        lVar3.x = wVar2;
        _Var1 = square_in_bounds((chunk *)c,lVar3);
        if ((((_Var1) &&
             (grid_09.y = chk.y, grid_09.x = wVar2, _Var1 = square_allowslos((chunk *)c,grid_09),
             _Var1)) &&
            (grid_10.y = chk.y, grid_10.x = wVar2, _Var1 = square_isglow((chunk *)c,grid_10), _Var1)
            ) && (sgrid_03.y = chk.y, sgrid_03.x = wVar2,
                 _Var1 = source_can_light_wall(c,p,sgrid_03,wgrid), _Var1)) {
          return true;
        }
        wVar2 = c_local._4_4_ + L'\x01';
        grid_11.y = chk.y;
        grid_11.x = wVar2;
        _Var1 = square_in_bounds((chunk *)c,grid_11);
        if (((_Var1) &&
            (grid_12.y = chk.y, grid_12.x = wVar2, _Var1 = square_allowslos((chunk *)c,grid_12),
            _Var1)) &&
           ((grid_13.y = chk.y, grid_13.x = wVar2, _Var1 = square_isglow((chunk *)c,grid_13), _Var1
            && (sgrid_04.y = chk.y, sgrid_04.x = wVar2,
               _Var1 = source_can_light_wall(c,p,sgrid_04,wgrid), _Var1)))) {
          return true;
        }
      }
      else {
        wStack_10 = wgrid.y;
        if (chk.y == wStack_10) {
          wVar2 = wStack_10 + L'\xffffffff';
          grid_03.y = wVar2;
          grid_03.x = chk.x;
          _Var1 = square_in_bounds((chunk *)c,grid_03);
          if (((_Var1) &&
              (grid_04.y = wVar2, grid_04.x = chk.x, _Var1 = square_allowslos((chunk *)c,grid_04),
              _Var1)) &&
             ((grid_05.y = wVar2, grid_05.x = chk.x, _Var1 = square_isglow((chunk *)c,grid_05),
              _Var1 && (sgrid_01.y = wVar2, sgrid_01.x = chk.x,
                       _Var1 = source_can_light_wall(c,p,sgrid_01,wgrid), _Var1)))) {
            return true;
          }
          wStack_10 = wStack_10 + L'\x01';
          grid_06.y = wStack_10;
          grid_06.x = chk.x;
          _Var1 = square_in_bounds((chunk *)c,grid_06);
          if ((((_Var1) &&
               (grid_07.y = wStack_10, grid_07.x = chk.x,
               _Var1 = square_allowslos((chunk *)c,grid_07), _Var1)) &&
              (grid_08.y = wStack_10, grid_08.x = chk.x, _Var1 = square_isglow((chunk *)c,grid_08),
              _Var1)) &&
             (sgrid_02.y = wStack_10, sgrid_02.x = chk.x,
             _Var1 = source_can_light_wall(c,p,sgrid_02,wgrid), _Var1)) {
            return true;
          }
        }
        else {
          grid.y = wStack_10;
          grid.x = chk.x;
          _Var1 = square_allowslos((chunk *)c,grid);
          if (((_Var1) &&
              (grid_00.y = wStack_10, grid_00.x = chk.x, _Var1 = square_isglow((chunk *)c,grid_00),
              _Var1)) &&
             (sgrid.y = wStack_10, sgrid.x = chk.x, _Var1 = source_can_light_wall(c,p,sgrid,wgrid),
             _Var1)) {
            return true;
          }
          grid_01.y = chk.y;
          grid_01.x = c_local._4_4_;
          _Var1 = square_allowslos((chunk *)c,grid_01);
          if (((_Var1) &&
              (grid_02.y = chk.y, grid_02.x = c_local._4_4_,
              _Var1 = square_isglow((chunk *)c,grid_02), _Var1)) &&
             (sgrid_00.y = chk.y, sgrid_00.x = c_local._4_4_,
             _Var1 = source_can_light_wall(c,p,sgrid_00,wgrid), _Var1)) {
            return true;
          }
        }
      }
      wgrid_local.x._3_1_ = false;
    }
  }
  return wgrid_local.x._3_1_;
}

Assistant:

static bool glow_can_light_wall(struct chunk *c, struct player *p,
		struct loc wgrid)
{
	struct loc pn = next_grid(wgrid, motion_dir(wgrid, p->grid)), chk;

	/*
	 * If the player is in the wall grid, the player will see the lit face.
	 */
	if (loc_eq(pn, wgrid)) return true;

	/*
	 * If the grid in the direction of the player is not a wall and is
	 * glowing, it'll illuminate the wall.
	 */
	if (square_allowslos(c, pn) && square_isglow(c, pn)) return true;

	/*
	 * Try the two neighboring squares adjacent to the one in the direction
	 * of the player to see if one or more will illuminate the wall by
	 * glowing.  Those could be out of bounds if the direction isn't
	 * diagonal.
	 */
	if (pn.x != wgrid.x) {
		if (pn.y != wgrid.y) {
			chk.x = pn.x;
			chk.y = wgrid.y;
			if (square_allowslos(c, chk) &&
					square_isglow(c, chk) &&
					source_can_light_wall(c, p, chk, wgrid))
				return true;
			chk.x = wgrid.x;
			chk.y = pn.y;
			if (square_allowslos(c, chk) &&
					square_isglow(c, chk) &&
					source_can_light_wall(c, p, chk, wgrid))
				return true;
		} else {
			chk.x = pn.x;
			chk.y = wgrid.y - 1;
			if (square_in_bounds(c, chk) &&
					square_allowslos(c, chk) &&
					square_isglow(c, chk) &&
					source_can_light_wall(c, p, chk, wgrid))
				return true;
			chk.y = wgrid.y + 1;
			if (square_in_bounds(c, chk) &&
					square_allowslos(c, chk) &&
					square_isglow(c, chk) &&
					source_can_light_wall(c, p, chk, wgrid))
				return true;
		}
	} else {
		chk.y = pn.y;
		chk.x = wgrid.x - 1;
		if (square_in_bounds(c, chk) && square_allowslos(c, chk) &&
				square_isglow(c, chk) &&
				source_can_light_wall(c, p, chk, wgrid))
			return true;
		chk.x = wgrid.x + 1;
		if (square_in_bounds(c, chk) && square_allowslos(c, chk) &&
				square_isglow(c, chk) &&
				source_can_light_wall(c, p, chk, wgrid))
			return true;
	}

	/*
	 * The adjacent squares towards the player won't light the wall by
	 * by glowing.
	 */
	return false;
}